

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O0

ostream * operator<<(ostream *os,Query *query)

{
  bool bVar1;
  uint32_t uVar2;
  QueryType *pQVar3;
  ostream *poVar4;
  runtime_error *this;
  Query *in_RSI;
  ostream *in_RDI;
  Query *in_stack_00000008;
  Query *q;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Query,_std::allocator<Query>_> *__range2;
  bool is_first;
  QueryType type;
  vector<Query,_std::allocator<Query>_> *in_stack_ffffffffffffff78;
  __normal_iterator<const_Query_*,_std::vector<Query,_std::allocator<Query>_>_>
  *in_stack_ffffffffffffff80;
  Query *in_stack_ffffffffffffff90;
  string local_58 [32];
  reference local_38;
  Query *local_30;
  __normal_iterator<const_Query_*,_std::vector<Query,_std::allocator<Query>_>_> local_28;
  vector<Query,_std::allocator<Query>_> *local_20;
  undefined4 in_stack_ffffffffffffffe8;
  uint uVar5;
  uint uVar6;
  QueryType QVar7;
  
  pQVar3 = Query::get_type(in_RSI);
  QVar7 = *pQVar3;
  if (((QVar7 == AND) || (QVar7 == OR)) || (QVar7 == MIN_OF)) {
    if (QVar7 == AND) {
      std::operator<<(in_RDI,"and(");
    }
    else if (QVar7 == OR) {
      std::operator<<(in_RDI,"or(");
    }
    else if (QVar7 == MIN_OF) {
      in_stack_ffffffffffffff90 = (Query *)std::operator<<(in_RDI,"min_of(");
      uVar2 = Query::as_count(in_RSI);
      poVar4 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffff90,uVar2);
      std::operator<<(poVar4,", ");
    }
    uVar5 = CONCAT13(1,(int3)in_stack_ffffffffffffffe8);
    local_20 = Query::as_queries(in_stack_ffffffffffffff90);
    local_28._M_current =
         (Query *)std::vector<Query,_std::allocator<Query>_>::begin(in_stack_ffffffffffffff78);
    local_30 = (Query *)std::vector<Query,_std::allocator<Query>_>::end(in_stack_ffffffffffffff78);
    while (bVar1 = __gnu_cxx::operator!=
                             (in_stack_ffffffffffffff80,
                              (__normal_iterator<const_Query_*,_std::vector<Query,_std::allocator<Query>_>_>
                               *)in_stack_ffffffffffffff78), bVar1) {
      local_38 = __gnu_cxx::
                 __normal_iterator<const_Query_*,_std::vector<Query,_std::allocator<Query>_>_>::
                 operator*(&local_28);
      if ((uVar5 & 0x1000000) == 0) {
        std::operator<<(in_RDI,", ");
      }
      uVar6 = uVar5 & 0xffffff;
      operator<<((ostream *)in_RSI,(Query *)(CONCAT44(QVar7,uVar5) & 0xffffffff00ffffff));
      __gnu_cxx::__normal_iterator<const_Query_*,_std::vector<Query,_std::allocator<Query>_>_>::
      operator++(&local_28);
      uVar5 = uVar6;
    }
    std::operator<<(in_RDI,")");
  }
  else {
    if (QVar7 != PRIMITIVE) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Unknown query type.");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    poVar4 = in_RDI;
    Query::as_string_repr_abi_cxx11_(in_stack_00000008);
    std::operator<<(poVar4,local_58);
    std::__cxx11::string::~string(local_58);
  }
  return in_RDI;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const Query &query) {
    QueryType type = query.get_type();
    if (type == QueryType::AND || type == QueryType::OR ||
        type == QueryType::MIN_OF) {
        if (type == QueryType::AND) {
            os << "and(";
        } else if (type == QueryType::OR) {
            os << "or(";
        } else if (type == QueryType::MIN_OF) {
            os << "min_of(" << query.as_count() << ", ";
        }

        bool is_first = true;
        for (const auto &q : query.as_queries()) {
            if (!is_first) {
                os << ", ";
            }
            is_first = false;
            os << q;
        }
        os << ")";
    } else if (type == QueryType::PRIMITIVE) {
        os << query.as_string_repr();
    } else {
        throw std::runtime_error("Unknown query type.");
    }
    return os;
}